

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::Validator::Validator(Validator *this)

{
  anon_class_1_0_00000001 *in_RDI;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *unaff_retaddr;
  anon_class_1_0_00000001 *__f;
  
  __f = in_RDI;
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::desc_function_::_lambda()_1_,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)unaff_retaddr,in_RDI);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::Validator::func_::_lambda(std::__cxx11::string&)_1_,void>(unaff_retaddr,__f);
  ::std::__cxx11::string::string((string *)(in_RDI + 0x40));
  *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
  in_RDI[100] = (anon_class_1_0_00000001)0x1;
  in_RDI[0x65] = (anon_class_1_0_00000001)0x0;
  return;
}

Assistant:

Validator() = default;